

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O0

void SpookyHash::Mix(uint64 *data,uint64 *s0,uint64 *s1,uint64 *s2,uint64 *s3,uint64 *s4,uint64 *s5,
                    uint64 *s6,uint64 *s7,uint64 *s8,uint64 *s9,uint64 *s10,uint64 *s11)

{
  uint64 uVar1;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  ulong *in_stack_00000038;
  
  *in_RSI = *in_RDI + *in_RSI;
  *in_RCX = *data ^ *in_RCX;
  *in_stack_00000038 = *in_RSI ^ *in_stack_00000038;
  uVar1 = Rot64(*in_RSI,0xb);
  *in_RSI = uVar1;
  *in_stack_00000038 = *in_RDX + *in_stack_00000038;
  *in_RDX = in_RDI[1] + *in_RDX;
  *in_R8 = *in_stack_00000038 ^ *in_R8;
  *in_RSI = *in_RDX ^ *in_RSI;
  uVar1 = Rot64(*in_RDX,0x20);
  *in_RDX = uVar1;
  *in_RSI = *in_RCX + *in_RSI;
  *in_RCX = in_RDI[2] + *in_RCX;
  *in_R9 = *in_RSI ^ *in_R9;
  *in_RDX = *in_RCX ^ *in_RDX;
  uVar1 = Rot64(*in_RCX,0x2b);
  *in_RCX = uVar1;
  *in_RDX = *in_R8 + *in_RDX;
  *in_R8 = in_RDI[3] + *in_R8;
  *s4 = *in_RDX ^ *s4;
  *in_RCX = *in_R8 ^ *in_RCX;
  uVar1 = Rot64(*in_R8,0x1f);
  *in_R8 = uVar1;
  *in_RCX = *in_R9 + *in_RCX;
  *in_R9 = in_RDI[4] + *in_R9;
  *s3 = *in_RCX ^ *s3;
  *in_R8 = *in_R9 ^ *in_R8;
  uVar1 = Rot64(*in_R9,0x11);
  *in_R9 = uVar1;
  *in_R8 = *s4 + *in_R8;
  *s4 = in_RDI[5] + *s4;
  *s2 = *in_R8 ^ *s2;
  *in_R9 = *s4 ^ *in_R9;
  uVar1 = Rot64(*s4,0x1c);
  *s4 = uVar1;
  *in_R9 = *s3 + *in_R9;
  *s3 = in_RDI[6] + *s3;
  *s1 = *in_R9 ^ *s1;
  *s4 = *s3 ^ *s4;
  uVar1 = Rot64(*s3,0x27);
  *s3 = uVar1;
  *s4 = *s2 + *s4;
  *s2 = in_RDI[7] + *s2;
  *s0 = *s4 ^ *s0;
  *s3 = *s2 ^ *s3;
  uVar1 = Rot64(*s2,0x39);
  *s2 = uVar1;
  *s3 = *s1 + *s3;
  *s1 = in_RDI[8] + *s1;
  *data = *s3 ^ *data;
  *s2 = *s1 ^ *s2;
  uVar1 = Rot64(*s1,0x37);
  *s1 = uVar1;
  *s2 = *s0 + *s2;
  *s0 = in_RDI[9] + *s0;
  *in_stack_00000038 = *s2 ^ *in_stack_00000038;
  *s1 = *s0 ^ *s1;
  uVar1 = Rot64(*s0,0x36);
  *s0 = uVar1;
  *s1 = *data + *s1;
  *data = in_RDI[10] + *data;
  *in_RSI = *s1 ^ *in_RSI;
  *s0 = *data ^ *s0;
  uVar1 = Rot64(*data,0x16);
  *data = uVar1;
  *s0 = *in_stack_00000038 + *s0;
  *in_stack_00000038 = in_RDI[0xb] + *in_stack_00000038;
  *in_RDX = *s0 ^ *in_RDX;
  *data = *in_stack_00000038 ^ *data;
  uVar1 = Rot64(*in_stack_00000038,0x2e);
  *in_stack_00000038 = uVar1;
  *data = *in_RSI + *data;
  return;
}

Assistant:

static INLINE void Mix(
        const uint64 *data, 
        uint64 &s0, uint64 &s1, uint64 &s2, uint64 &s3,
        uint64 &s4, uint64 &s5, uint64 &s6, uint64 &s7,
        uint64 &s8, uint64 &s9, uint64 &s10,uint64 &s11)
    {
      s0 += data[0];    s2 ^= s10;    s11 ^= s0;    s0 = Rot64(s0,11);    s11 += s1;
      s1 += data[1];    s3 ^= s11;    s0 ^= s1;    s1 = Rot64(s1,32);    s0 += s2;
      s2 += data[2];    s4 ^= s0;    s1 ^= s2;    s2 = Rot64(s2,43);    s1 += s3;
      s3 += data[3];    s5 ^= s1;    s2 ^= s3;    s3 = Rot64(s3,31);    s2 += s4;
      s4 += data[4];    s6 ^= s2;    s3 ^= s4;    s4 = Rot64(s4,17);    s3 += s5;
      s5 += data[5];    s7 ^= s3;    s4 ^= s5;    s5 = Rot64(s5,28);    s4 += s6;
      s6 += data[6];    s8 ^= s4;    s5 ^= s6;    s6 = Rot64(s6,39);    s5 += s7;
      s7 += data[7];    s9 ^= s5;    s6 ^= s7;    s7 = Rot64(s7,57);    s6 += s8;
      s8 += data[8];    s10 ^= s6;    s7 ^= s8;    s8 = Rot64(s8,55);    s7 += s9;
      s9 += data[9];    s11 ^= s7;    s8 ^= s9;    s9 = Rot64(s9,54);    s8 += s10;
      s10 += data[10];    s0 ^= s8;    s9 ^= s10;    s10 = Rot64(s10,22);    s9 += s11;
      s11 += data[11];    s1 ^= s9;    s10 ^= s11;    s11 = Rot64(s11,46);    s10 += s0;
    }